

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadDataArray(ColladaParser *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *this_00;
  char *pName;
  bool local_162;
  float local_148;
  allocator<char> local_141;
  ai_real value;
  uint local_120;
  allocator<char> local_119;
  uint a_1;
  uint local_f4;
  undefined1 local_f0 [4];
  uint a;
  string s;
  Data *data;
  pointer pfStack_c0;
  pointer local_b8;
  pointer pfStack_b0;
  pointer local_a8;
  pointer pbStack_a0;
  pointer local_98;
  char *local_88;
  char *content;
  uint local_78;
  uint count;
  int indexCount;
  string id;
  int indexID;
  bool isEmptyElement;
  bool isStringArray;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string elmName;
  ColladaParser *this_local;
  
  elmName.field_2._8_8_ = this;
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,(char *)CONCAT44(extraout_var,iVar3),&local_31);
  std::allocator<char>::~allocator(&local_31);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"IDREF_array");
  local_162 = true;
  if (!bVar2) {
    local_162 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"Name_array");
  }
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  id.field_2._12_4_ = GetAttribute(this,"id");
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)id.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indexCount,(char *)CONCAT44(extraout_var_00,iVar3),
             (allocator<char> *)((long)&count + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&count + 3));
  local_78 = GetAttribute(this,"count");
  content._4_4_ = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)local_78);
  local_88 = TestTextContent(this);
  local_a8 = (pointer)0x0;
  pbStack_a0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  pfStack_b0 = (pointer)0x0;
  data = (Data *)0x0;
  pfStack_c0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  Collada::Data::Data((Data *)&data);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
            ::operator[](&this->mDataLibrary,(key_type *)&indexCount);
  Collada::Data::operator=(this_00,(Data *)&data);
  Collada::Data::~Data((Data *)&data);
  s.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
       ::operator[](&this->mDataLibrary,(key_type *)&indexCount);
  ((mapped_type *)s.field_2._8_8_)->mIsStringArray = local_162;
  if (local_88 != (char *)0x0) {
    if (local_162 == false) {
      std::vector<float,_std::allocator<float>_>::reserve
                (&((mapped_type *)s.field_2._8_8_)->mValues,(ulong)content._4_4_);
      for (local_120 = 0; local_120 < content._4_4_; local_120 = local_120 + 1) {
        if (*local_88 == '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&value,"Expected more values while reading float_array contents.",
                     &local_141);
          ThrowException(this,(string *)&value);
        }
        local_88 = fast_atoreal_move<float>(local_88,&local_148,true);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)(s.field_2._8_8_ + 8),&local_148);
        SkipSpacesAndLineEnd<char>(&local_88);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&((mapped_type *)s.field_2._8_8_)->mStrings,(ulong)content._4_4_);
      std::__cxx11::string::string((string *)local_f0);
      for (local_f4 = 0; local_f4 < content._4_4_; local_f4 = local_f4 + 1) {
        if (*local_88 == '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&a_1,"Expected more values while reading IDREF_array contents.",
                     &local_119);
          ThrowException(this,(string *)&a_1);
        }
        std::__cxx11::string::clear();
        while (bVar2 = IsSpaceOrNewLine<char>(*local_88), ((bVar2 ^ 0xffU) & 1) != 0) {
          cVar1 = *local_88;
          local_88 = local_88 + 1;
          std::__cxx11::string::operator+=((string *)local_f0,cVar1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(s.field_2._8_8_ + 0x20),(value_type *)local_f0);
        SkipSpacesAndLineEnd<char>(&local_88);
      }
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  if ((uVar4 & 1) == 0) {
    pName = (char *)std::__cxx11::string::c_str();
    TestClosing(this,pName);
  }
  std::__cxx11::string::~string((string *)&indexCount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ColladaParser::ReadDataArray()
{
    std::string elmName = mReader->getNodeName();
    bool isStringArray = (elmName == "IDREF_array" || elmName == "Name_array");
    bool isEmptyElement = mReader->isEmptyElement();

    // read attributes
    int indexID = GetAttribute("id");
    std::string id = mReader->getAttributeValue(indexID);
    int indexCount = GetAttribute("count");
    unsigned int count = (unsigned int)mReader->getAttributeValueAsInt(indexCount);
    const char* content = TestTextContent();

    // read values and store inside an array in the data library
    mDataLibrary[id] = Data();
    Data& data = mDataLibrary[id];
    data.mIsStringArray = isStringArray;

    // some exporters write empty data arrays, but we need to conserve them anyways because others might reference them
    if (content)
    {
        if (isStringArray)
        {
            data.mStrings.reserve(count);
            std::string s;

            for (unsigned int a = 0; a < count; a++)
            {
                if (*content == 0)
                    ThrowException("Expected more values while reading IDREF_array contents.");

                s.clear();
                while (!IsSpaceOrNewLine(*content))
                    s += *content++;
                data.mStrings.push_back(s);

                SkipSpacesAndLineEnd(&content);
            }
        }
        else
        {
            data.mValues.reserve(count);

            for (unsigned int a = 0; a < count; a++)
            {
                if (*content == 0)
                    ThrowException("Expected more values while reading float_array contents.");

                ai_real value;
                // read a number
                content = fast_atoreal_move<ai_real>(content, value);
                data.mValues.push_back(value);
                // skip whitespace after it
                SkipSpacesAndLineEnd(&content);
            }
        }
    }

    // test for closing tag
    if (!isEmptyElement)
        TestClosing(elmName.c_str());
}